

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

void __thiscall
capnp::compiler::ModuleLoader::Impl::addImportPath(Impl *this,ReadableDirectory *dir)

{
  ReadableDirectory *local_8;
  
  local_8 = dir;
  kj::Vector<kj::ReadableDirectory_const*>::add<kj::ReadableDirectory_const*>
            ((Vector<kj::ReadableDirectory_const*> *)&this->searchPath,&local_8);
  return;
}

Assistant:

void addImportPath(const kj::ReadableDirectory& dir) {
    searchPath.add(&dir);
  }